

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O2

void audit_regressor_feature(audit_regressor_data *dat,float param_2,uint64_t ft_idx)

{
  parameters *this;
  weight *pwVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  ostream *poVar3;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_248;
  string temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string ns_pre;
  string local_1c8;
  ostringstream tempstream;
  
  this = &dat->all->weights;
  pwVar1 = parameters::operator[](this,ft_idx);
  if ((*pwVar1 != 0.0) || (NAN(*pwVar1))) {
    dat->values_audited = dat->values_audited + 1;
    ns_pre._M_dataplus._M_p = (pointer)&ns_pre.field_2;
    ns_pre._M_string_length = 0;
    ns_pre.field_2._M_local_buf[0] = '\0';
    pvVar2 = dat->ns_pre;
    for (pbVar4 = (pvVar2->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar4 != (pvVar2->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
      std::__cxx11::string::append((string *)&ns_pre);
      pvVar2 = dat->ns_pre;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tempstream);
    poVar3 = std::operator<<((ostream *)&tempstream,':');
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,':');
    pwVar1 = parameters::operator[](this,ft_idx);
    std::ostream::operator<<(poVar3,*pwVar1);
    std::__cxx11::stringbuf::str();
    std::operator+(&local_208,&ns_pre,&bStack_248);
    std::operator+(&temp,&local_208,'\n');
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&bStack_248);
    if (1 < dat->total_class_cnt) {
      std::__cxx11::to_string(&local_1c8,dat->cur_class);
      std::operator+(&bStack_248,&local_1c8,':');
      std::operator+(&local_208,&bStack_248,&temp);
      std::__cxx11::string::operator=((string *)&temp,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&bStack_248);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    io_buf::bin_write_fixed(dat->out_file,temp._M_dataplus._M_p,(ulong)(uint)temp._M_string_length);
    pwVar1 = parameters::operator[](this,ft_idx);
    *pwVar1 = 0.0;
    std::__cxx11::string::~string((string *)&temp);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tempstream);
    std::__cxx11::string::~string((string *)&ns_pre);
  }
  return;
}

Assistant:

inline void audit_regressor_feature(audit_regressor_data& dat, const float, const uint64_t ft_idx)
{
  parameters& weights = dat.all->weights;
  if (weights[ft_idx] != 0)
    ++dat.values_audited;
  else
    return;

  string ns_pre;
  for (vector<string>::const_iterator s = dat.ns_pre->begin(); s != dat.ns_pre->end(); ++s) ns_pre += *s;

  ostringstream tempstream;
  tempstream << ':' << ((ft_idx & weights.mask()) >> weights.stride_shift()) << ':' << weights[ft_idx];

  string temp = ns_pre + tempstream.str() + '\n';
  if (dat.total_class_cnt > 1)  // add class prefix for multiclass problems
    temp = to_string(dat.cur_class) + ':' + temp;

  dat.out_file->bin_write_fixed(temp.c_str(), (uint32_t)temp.size());

  weights[ft_idx] = 0.;  // mark value audited
}